

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::CopyClassExpressionSyntax::setChild
          (CopyClassExpressionSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  long in_RSI;
  long in_RDI;
  ExpressionSyntax *local_50;
  NameSyntax *local_48;
  ExpressionSyntax *local_30;
  not_null<slang::syntax::ExpressionSyntax_*> local_28;
  NameSyntax *local_20;
  not_null<slang::syntax::NameSyntax_*> local_18 [3];
  
  if (in_RSI == 0) {
    pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x99c45a);
    if (pSVar1 == (SyntaxNode *)0x0) {
      local_48 = (NameSyntax *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x99c46a);
      local_48 = SyntaxNode::as<slang::syntax::NameSyntax>(pSVar1);
    }
    local_20 = local_48;
    not_null<slang::syntax::NameSyntax_*>::not_null<slang::syntax::NameSyntax_*>(local_18,&local_20)
    ;
    *(NameSyntax **)(in_RDI + 0x18) = local_18[0].ptr;
  }
  else {
    pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x99c4b5);
    if (pSVar1 == (SyntaxNode *)0x0) {
      local_50 = (ExpressionSyntax *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x99c4c5);
      local_50 = SyntaxNode::as<slang::syntax::ExpressionSyntax>(pSVar1);
    }
    local_30 = local_50;
    not_null<slang::syntax::ExpressionSyntax_*>::not_null<slang::syntax::ExpressionSyntax_*>
              (&local_28,&local_30);
    *(ExpressionSyntax **)(in_RDI + 0x20) = local_28.ptr;
  }
  return;
}

Assistant:

void CopyClassExpressionSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: scopedNew = child.node() ? &child.node()->as<NameSyntax>() : nullptr; return;
        case 1: expr = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}